

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictTrie.hpp
# Opt level: O0

void __thiscall
cppjieba::DictTrie::DictTrie
          (DictTrie *this,string *dict_path,string *user_dict_paths,
          UserWordWeightOption user_word_weight_opt)

{
  DictTrie *in_RDI;
  UserWordWeightOption in_stack_ffffffffffffffac;
  string *user_dict_paths_00;
  DictTrie *this_00;
  
  this_00 = in_RDI;
  std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::vector
            ((vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *)0x13df0e);
  std::deque<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::deque
            ((deque<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *)0x13df21);
  user_dict_paths_00 = (string *)&in_RDI->user_dict_single_chinese_word_;
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)0x13df39);
  Init(this_00,(string *)in_RDI,user_dict_paths_00,in_stack_ffffffffffffffac);
  return;
}

Assistant:

DictTrie(const string& dict_path, const string& user_dict_paths = "", UserWordWeightOption user_word_weight_opt = WordWeightMedian) {
    Init(dict_path, user_dict_paths, user_word_weight_opt);
  }